

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  long lVar2;
  string *psVar3;
  ostream *poVar4;
  pointer pSVar5;
  ConsoleReporter *this_00;
  SourceLineInfo lineInfo;
  
  if ((this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo.
                           super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    pSVar5 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(this->super_StreamingReporterBase).m_sectionStack.
                  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5;
    if (1 < (ulong)(lVar2 / 0x68)) {
      this_00 = Colour::impl;
      (*(Colour::impl->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
        super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable[2])
                (Colour::impl,1,lVar2 % 0x68);
      pSVar5 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar5 = pSVar5 + 1, pSVar5 != pSVar1) {
        this_00 = this;
        printHeaderString(this,&pSVar5->name,2);
      }
      Colour::~Colour((Colour *)this_00);
      pSVar5 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    SourceLineInfo::SourceLineInfo(&lineInfo,&pSVar5->lineInfo);
    if (lineInfo.file._M_string_length != 0) {
      poVar4 = (this->super_StreamingReporterBase).stream;
      psVar3 = getDashes_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      std::operator<<(poVar4,"\n");
      (*(Colour::impl->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
        super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable[2])
                (Colour::impl,0x17);
      poVar4 = operator<<((this->super_StreamingReporterBase).stream,&lineInfo);
      std::operator<<(poVar4,"\n");
      Colour::~Colour((Colour *)poVar4);
    }
    poVar4 = (this->super_StreamingReporterBase).stream;
    psVar3 = getDots_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&lineInfo);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jjh13[P]sisl/test/../include/catch/catch.hpp"
                ,0x1d5c,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }